

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::RestrainSide
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,int side,TPZInterpolatedElement *large,
          int neighbourside)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  TPZConnect *pTVar13;
  TPZGeoEl *pTVar14;
  TPZFNMatrix<1000,_double> *this_00;
  int64_t myindex;
  int64_t iVar15;
  TPZDepend *pTVar16;
  TNode *col;
  uint uVar17;
  ulong uVar18;
  size_t lineN;
  _func_int **row;
  int jn;
  int iVar19;
  ulong uVar20;
  int iaxes;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int jn_2;
  bool bVar25;
  double local_3c08;
  ulong local_3bd0;
  TPZAutoPointer<TPZMatrix<double>_> local_3ba0;
  REAL weight;
  ulong local_3b90;
  TPZVec<double> centerPoint;
  TPZGeoElSide thisGeoSide;
  REAL detjac;
  TPZGeoElSide largeGeoSide;
  TPZCompElSide largeCompSide;
  TPZManVector<double,_3> pointl;
  TPZManVector<double,_3> par;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<20,_double> blocknorm;
  TPZGeoElSide local_3458;
  TPZFNMatrix<100,_double> thisTrace;
  TPZBlock MBlocklarge;
  TPZBlock MBlocksmall;
  TPZStepSolver<double> MSolve;
  TPZFNMatrix<100,_double> largeTrace;
  TPZTransform<double> t;
  TPZFNMatrix<1000,_double> MSL;
  
  largeCompSide.fEl = (TPZCompEl *)large;
  largeCompSide.fSide = neighbourside;
  thisGeoSide.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
  thisGeoSide.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
  thisGeoSide.fSide = side;
  TPZCompElSide::Reference(&largeGeoSide,&largeCompSide);
  iVar5 = TPZGeoElSide::Dimension(&thisGeoSide);
  iVar6 = TPZGeoElSide::Dimension(&largeGeoSide);
  if (largeCompSide.fEl == (TPZCompEl *)0x0) {
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)__dynamic_cast(largeCompSide.fEl,&TPZCompEl::typeinfo,
                                     &TPZInterpolatedElement::typeinfo,0);
  }
  if (plVar11 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting RestrainSide - null computational element.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  else {
    iVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x310))(this,side);
    if (iVar7 < 0) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                 ,0x2a6);
    }
    lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                    super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                    super_TPZCompEl + 0xa8))(this,iVar7);
    if (*(int *)(lVar12 + 0x18) != 0) {
      if ((0 < iVar6) && (*(long *)(lVar12 + 0x20) != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"RestrainSide - unnecessary call to restrainside",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                   ,0x2af);
      }
      uVar8 = (**(code **)(*plVar11 + 0x310))(plVar11,largeCompSide.fSide);
      lVar12 = (**(code **)(*plVar11 + 0xa0))(plVar11,uVar8);
      if (lVar12 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Exiting RestrainSide - Side of large element not initialized",0x3c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        lineN = 0x2b3;
      }
      else {
        if (iVar6 != 0) {
          TPZTransform<double>::TPZTransform(&t,iVar5);
          local_3458.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
          local_3458.fGeoEl = largeGeoSide.fGeoEl;
          local_3458.fSide = largeGeoSide.fSide;
          TPZGeoElSide::SideTransform3(&thisGeoSide,&local_3458,&t);
          iVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x248))(this,side);
          if (iVar7 < 1) {
            iVar7 = 2;
          }
          else {
            iVar19 = 0;
            uVar9 = 1;
            do {
              pTVar13 = TPZInterpolatedElement::SideConnect
                                  ((TPZInterpolatedElement *)this,iVar19,side);
              bVar2 = (pTVar13->field_2).fCompose.fOrder;
              if (uVar9 <= bVar2) {
                uVar9 = (uint)bVar2;
              }
              iVar19 = iVar19 + 1;
            } while (iVar7 != iVar19);
            iVar7 = uVar9 * 2;
          }
          iVar19 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                               0x338))(large,neighbourside);
          lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0x318))(this,side);
          if ((iVar5 != 0) && ((int)(uint)*(byte *)(lVar12 + 0x14) < iVar19)) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                       ,0x2c7);
          }
          pTVar14 = TPZCompEl::Reference((TPZCompEl *)this);
          plVar11 = (long *)(**(code **)(*(long *)pTVar14 + 0x70))(pTVar14,side,iVar7);
          if (plVar11 == (long *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Exiting RestrainSide - cannot create side integration rule",0x3a);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
          else {
            iVar7 = (**(code **)(*plVar11 + 0x18))(plVar11);
            uVar9 = TPZInterpolatedElement::NSideShapeF((TPZInterpolatedElement *)this,side);
            uVar10 = TPZInterpolatedElement::NSideShapeF(large,neighbourside);
            row = (_func_int **)(long)(int)uVar9;
            col = (TNode *)(long)(int)uVar10;
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZFNMatrix<1000,_double>::TPZFNMatrix
                      (&MSL,(int64_t)row,(int64_t)col,(double *)&blocknorm);
            this_00 = (TPZFNMatrix<1000,_double> *)operator_new(0x1fd8);
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZFNMatrix<1000,_double>::TPZFNMatrix
                      (this_00,(int64_t)row,(int64_t)row,(double *)&blocknorm);
            lVar12 = (long)iVar5;
            TPZManVector<double,_3>::TPZManVector(&par,lVar12);
            TPZManVector<double,_3>::TPZManVector(&pointl,(long)iVar6);
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZVec<double>::TPZVec(&centerPoint,lVar12,(double *)&blocknorm);
            TPZGeoElSide::CenterPoint(&thisGeoSide,&centerPoint);
            jac.super_TPZFMatrix<double>.fElem = jac.fBuf;
            jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
                 '\0';
            jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive =
                 '\0';
            jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183dbe0;
            jac.super_TPZFMatrix<double>.fSize = 9;
            jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar12;
            jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar12;
            jac.super_TPZFMatrix<double>.fGiven = jac.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&jac.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            jac.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 jac.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            jac.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            jac.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            jac.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            jac.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            jac.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            jac.super_TPZFMatrix<double>.fWork.fNElements = 0;
            jac.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            uVar21 = lVar12 * lVar12;
            if (iVar5 == 0) {
              jac.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (9 < uVar21) {
              uVar20 = 0xffffffffffffffff;
              if (uVar21 < 0x2000000000000000) {
                uVar20 = uVar21 * 8;
              }
              jac.super_TPZFMatrix<double>.fElem = (double *)operator_new__(uVar20);
            }
            jac.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
            jacinv.super_TPZFMatrix<double>.fElem = jacinv.fBuf;
            jacinv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
                 = '\0';
            jacinv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
                 = '\0';
            jacinv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183dbe0;
            jacinv.super_TPZFMatrix<double>.fSize = 9;
            jacinv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 lVar12;
            jacinv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
                 lVar12;
            jacinv.super_TPZFMatrix<double>.fGiven = jacinv.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&jacinv.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            jacinv.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 jacinv.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            jacinv.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            jacinv.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            jacinv.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            jacinv.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0
            ;
            jacinv.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            jacinv.super_TPZFMatrix<double>.fWork.fNElements = 0;
            jacinv.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (iVar5 == 0) {
              jacinv.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (9 < uVar21) {
              uVar20 = 0xffffffffffffffff;
              if (uVar21 < 0x2000000000000000) {
                uVar20 = uVar21 * 8;
              }
              jacinv.super_TPZFMatrix<double>.fElem = (double *)operator_new__(uVar20);
            }
            jacinv.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
            axes.super_TPZFMatrix<double>.fElem = axes.fBuf;
            axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
            axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
                 '\0';
            axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive =
                 '\0';
            axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183dbe0;
            axes.super_TPZFMatrix<double>.fSize = 9;
            axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar12;
            axes.super_TPZFMatrix<double>.fGiven = axes.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&axes.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            axes.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 axes.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            axes.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            axes.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            axes.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            axes.super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            axes.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            axes.super_TPZFMatrix<double>.fWork.fNElements = 0;
            axes.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (iVar5 == 0) {
              axes.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (3 < iVar5) {
              uVar21 = 0xffffffffffffffff;
              if ((ulong)(lVar12 * 3) < 0x2000000000000000) {
                uVar21 = lVar12 * 0x18;
              }
              axes.super_TPZFMatrix<double>.fElem = (double *)operator_new__(uVar21);
            }
            axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
            TPZGeoElSide::Jacobian
                      (&thisGeoSide,&centerPoint,&jac.super_TPZFMatrix<double>,
                       &axes.super_TPZFMatrix<double>,&detjac,&jacinv.super_TPZFMatrix<double>);
            blocknorm.super_TPZFMatrix<double>.fElem = blocknorm.fBuf;
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fDecomposed = '\0';
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fDefPositive = '\0';
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            blocknorm.super_TPZFMatrix<double>.fSize = 100;
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 (int64_t)row;
            blocknorm.super_TPZFMatrix<double>.fGiven = blocknorm.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&blocknorm.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            blocknorm.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 blocknorm.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            blocknorm.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            blocknorm.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            blocknorm.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            blocknorm.super_TPZFMatrix<double>.fWork._vptr_TPZVec =
                 (_func_int **)&PTR__TPZVec_0183b4b0;
            blocknorm.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            blocknorm.super_TPZFMatrix<double>.fWork.fNElements = 0;
            blocknorm.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            uVar21 = (long)row * 3;
            if (uVar9 == 0) {
              blocknorm.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (0x21 < (int)uVar9) {
              uVar20 = 0xffffffffffffffff;
              if (uVar21 < 0x2000000000000000) {
                uVar20 = (long)row * 0x18;
              }
              blocknorm.super_TPZFMatrix<double>.fElem = (double *)operator_new__(uVar20);
            }
            blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fCol =
                 (int64_t)&MSolve.super_TPZMatrixSolver<double>.fScratch.fWork.fNElements;
            MSolve.super_TPZMatrixSolver<double>.fReferenceMatrix.fRef = (TPZReference *)0x3;
            MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fRow._0_2_ = 0;
            MSolve.super_TPZMatrixSolver<double>.super_TPZSolver.super_TPZSavable._vptr_TPZSavable =
                 (TPZSavable)&PTR__TPZFMatrix_0185f360;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fElem = (double *)0x64;
            MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
            super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = row;
            MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
            super_TPZBaseMatrix._24_8_ =
                 MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fCol;
            TPZVec<int>::TPZVec((TPZVec<int> *)&MSolve.super_TPZMatrixSolver<double>.fScratch.fGiven
                                ,0);
            MSolve.super_TPZMatrixSolver<double>.fScratch.fSize =
                 (int64_t)&MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.super_TPZVec<int>.
                           fNElements;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fGiven =
                 (double *)&PTR__TPZManVector_0183cde8;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)0x0;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.super_TPZVec<int>.fStore =
                 (int *)0x0;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.fExtAlloc._8_8_ =
                 &PTR__TPZVec_0183b4b0;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot.fExtAlloc[4] = 0;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fPivot._52_4_ = 0;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fWork._vptr_TPZVec = (_func_int **)0x0;
            MSolve.super_TPZMatrixSolver<double>.fScratch.fWork.fStore = (double *)0x0;
            if (uVar9 == 0) {
              MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol = 0;
            }
            else if (0x21 < (int)uVar9) {
              uVar20 = 0xffffffffffffffff;
              if (uVar21 < 0x2000000000000000) {
                uVar20 = (long)row * 0x18;
              }
              MSolve.super_TPZMatrixSolver<double>.fScratch.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol = (int64_t)operator_new__(uVar20);
            }
            MSolve.super_TPZMatrixSolver<double>.super_TPZSolver.super_TPZSavable._vptr_TPZSavable =
                 (TPZSavable)&PTR__TPZFNMatrix_0185f070;
            MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
                 (int64_t)&MBlocksmall.fBlock.fExtAlloc[6].pos;
            MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (TNode *)0x3;
            MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNElements._0_2_ = 0;
            MBlocksmall.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            MBlocksmall.fBlock.fExtAlloc[0].pos = 100;
            MBlocksmall.fBlock.fExtAlloc[0].dim = 0;
            MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec = (_func_int **)col;
            MBlocksmall.fBlock.fExtAlloc[0].super_TPZSavable._vptr_TPZSavable =
                 (_func_int **)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc;
            TPZVec<int>::TPZVec((TPZVec<int> *)(MBlocksmall.fBlock.fExtAlloc + 1),0);
            MBlocksmall.fBlock.fExtAlloc[1]._8_8_ = MBlocksmall.fBlock.fExtAlloc + 3;
            MBlocksmall.fBlock.fExtAlloc[1].super_TPZSavable._vptr_TPZSavable =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            MBlocksmall.fBlock.fExtAlloc[2].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            MBlocksmall.fBlock.fExtAlloc[2].pos = 0;
            MBlocksmall.fBlock.fExtAlloc[2].dim = 0;
            MBlocksmall.fBlock.fExtAlloc[4]._8_8_ = &PTR__TPZVec_0183b4b0;
            MBlocksmall.fBlock.fExtAlloc[5].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            MBlocksmall.fBlock.fExtAlloc[5].pos = 0;
            MBlocksmall.fBlock.fExtAlloc[5].dim = 0;
            MBlocksmall.fBlock.fExtAlloc[6].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            uVar20 = (long)col * 3;
            if (uVar10 == 0) {
              MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
            }
            else if (0x21 < (int)uVar10) {
              uVar22 = 0xffffffffffffffff;
              if (uVar20 < 0x2000000000000000) {
                uVar22 = (long)col * 0x18;
              }
              MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
                   (int64_t)operator_new__(uVar22);
            }
            MBlocksmall.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070
            ;
            MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
                 (int64_t)&MBlocklarge.fBlock.fExtAlloc[6].pos;
            MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec = (_func_int **)0x3;
            MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNElements._0_2_ = 0;
            MBlocklarge.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            MBlocklarge.fBlock.fExtAlloc[0].pos = 100;
            MBlocklarge.fBlock.fExtAlloc[0].dim = 0;
            MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore = col;
            MBlocklarge.fBlock.fExtAlloc[0].super_TPZSavable._vptr_TPZSavable =
                 (_func_int **)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc;
            TPZVec<int>::TPZVec((TPZVec<int> *)(MBlocklarge.fBlock.fExtAlloc + 1),0);
            MBlocklarge.fBlock.fExtAlloc[1]._8_8_ = MBlocklarge.fBlock.fExtAlloc + 3;
            MBlocklarge.fBlock.fExtAlloc[1].super_TPZSavable._vptr_TPZSavable =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            MBlocklarge.fBlock.fExtAlloc[2].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            MBlocklarge.fBlock.fExtAlloc[2].pos = 0;
            MBlocklarge.fBlock.fExtAlloc[2].dim = 0;
            MBlocklarge.fBlock.fExtAlloc[4]._8_8_ = &PTR__TPZVec_0183b4b0;
            MBlocklarge.fBlock.fExtAlloc[5].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            MBlocklarge.fBlock.fExtAlloc[5].pos = 0;
            MBlocklarge.fBlock.fExtAlloc[5].dim = 0;
            MBlocklarge.fBlock.fExtAlloc[6].super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            if (uVar10 == 0) {
              MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
            }
            else if (0x21 < (int)uVar10) {
              uVar22 = 0xffffffffffffffff;
              if (uVar20 < 0x2000000000000000) {
                uVar22 = (long)col * 0x18;
              }
              MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc =
                   (int64_t)operator_new__(uVar22);
            }
            MBlocklarge.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070
            ;
            thisTrace.super_TPZFMatrix<double>.fElem = thisTrace.fBuf;
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fDecomposed = '\0';
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fDefPositive = '\0';
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            thisTrace.super_TPZFMatrix<double>.fSize = 100;
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 (int64_t)row;
            thisTrace.super_TPZFMatrix<double>.fGiven = thisTrace.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&thisTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            thisTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 thisTrace.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            thisTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            thisTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            thisTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            thisTrace.super_TPZFMatrix<double>.fWork._vptr_TPZVec =
                 (_func_int **)&PTR__TPZVec_0183b4b0;
            thisTrace.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            thisTrace.super_TPZFMatrix<double>.fWork.fNElements = 0;
            thisTrace.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (uVar9 == 0) {
              thisTrace.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (0x21 < (int)uVar9) {
              uVar22 = 0xffffffffffffffff;
              if (uVar21 < 0x2000000000000000) {
                uVar22 = (long)row * 0x18;
              }
              thisTrace.super_TPZFMatrix<double>.fElem = (double *)operator_new__(uVar22);
            }
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            largeTrace.super_TPZFMatrix<double>.fElem = largeTrace.fBuf;
            largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3
            ;
            largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fDecomposed = '\0';
            largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            fDefPositive = '\0';
            largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0185f360;
            largeTrace.super_TPZFMatrix<double>.fSize = 100;
            largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 (int64_t)col;
            largeTrace.super_TPZFMatrix<double>.fGiven = largeTrace.super_TPZFMatrix<double>.fElem;
            TPZVec<int>::TPZVec(&largeTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
            largeTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
                 largeTrace.super_TPZFMatrix<double>.fPivot.fExtAlloc;
            largeTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            largeTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
            largeTrace.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
            largeTrace.super_TPZFMatrix<double>.fWork._vptr_TPZVec =
                 (_func_int **)&PTR__TPZVec_0183b4b0;
            largeTrace.super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
            largeTrace.super_TPZFMatrix<double>.fWork.fNElements = 0;
            largeTrace.super_TPZFMatrix<double>.fWork.fNAlloc = 0;
            if (uVar10 == 0) {
              largeTrace.super_TPZFMatrix<double>.fElem = (double *)0x0;
            }
            else if (0x21 < (int)uVar10) {
              uVar21 = 0xffffffffffffffff;
              if (uVar20 < 0x2000000000000000) {
                uVar21 = (long)col * 0x18;
              }
              largeTrace.super_TPZFMatrix<double>.fElem = (double *)operator_new__(uVar21);
            }
            largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0185f070;
            if (0 < iVar7) {
              iVar5 = 0;
              do {
                (**(code **)(*plVar11 + 0x20))(plVar11,iVar5,&par,&weight);
                (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x288))(this,side,&par,&thisTrace,&MSolve);
                TPZTransform<double>::Apply
                          (&t,&par.super_TPZVec<double>,&pointl.super_TPZVec<double>);
                (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl + 0x288)
                )(large,neighbourside,&pointl,&largeTrace,&MBlocklarge);
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  do {
                    uVar20 = 0;
                    do {
                      local_3c08 = 0.0;
                      lVar12 = 0;
                      do {
                        if ((thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                           (thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fCol <= lVar12)) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        if ((thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                           (thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fCol <= lVar12)) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        local_3c08 = local_3c08 +
                                     thisTrace.super_TPZFMatrix<double>.fElem
                                     [thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                      super_TPZBaseMatrix.fRow * lVar12 + uVar21] *
                                     thisTrace.super_TPZFMatrix<double>.fElem
                                     [thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                      super_TPZBaseMatrix.fRow * lVar12 + uVar20];
                        lVar12 = lVar12 + 1;
                      } while (lVar12 != 3);
                      if (((this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                         ((this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar20)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      lVar12 = (this_00->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * uVar20;
                      pdVar4 = (this_00->super_TPZFMatrix<double>).fElem;
                      pdVar4[lVar12 + uVar21] = local_3c08 * weight + pdVar4[lVar12 + uVar21];
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != uVar9);
                    if (0 < (int)uVar10) {
                      uVar20 = 0;
                      do {
                        local_3c08 = 0.0;
                        lVar12 = 0;
                        do {
                          if ((thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                             (thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                              super_TPZBaseMatrix.fCol <= lVar12)) {
                            TPZFMatrix<double>::Error
                                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                            pzinternal::DebugStopImpl
                                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                       ,0x26d);
                          }
                          if ((largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                             (largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                              super_TPZBaseMatrix.fCol <= lVar12)) {
                            TPZFMatrix<double>::Error
                                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                            pzinternal::DebugStopImpl
                                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                       ,0x26d);
                          }
                          local_3c08 = local_3c08 +
                                       thisTrace.super_TPZFMatrix<double>.fElem
                                       [thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                        super_TPZBaseMatrix.fRow * lVar12 + uVar21] *
                                       largeTrace.super_TPZFMatrix<double>.fElem
                                       [largeTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                        super_TPZBaseMatrix.fRow * lVar12 + uVar20];
                          lVar12 = lVar12 + 1;
                        } while (lVar12 != 3);
                        if ((MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                           (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                            .fCol <= (long)uVar20)) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        MSL.super_TPZFMatrix<double>.fElem
                        [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                         fRow * uVar20 + uVar21] =
                             local_3c08 * weight +
                             MSL.super_TPZFMatrix<double>.fElem
                             [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                              super_TPZBaseMatrix.fRow * uVar20 + uVar21];
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar10);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar9);
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 != iVar7);
            }
            TPZFMatrix<double>::~TPZFMatrix(&largeTrace.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix(&thisTrace.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&MBlocklarge,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&MBlocksmall,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&MSolve,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix(&blocknorm.super_TPZFMatrix<double>,&PTR_PTR_0185f328);
            TPZFMatrix<double>::~TPZFMatrix(&axes.super_TPZFMatrix<double>,&PTR_PTR_0183dba8);
            TPZFMatrix<double>::~TPZFMatrix(&jacinv.super_TPZFMatrix<double>,&PTR_PTR_0183dba8);
            TPZFMatrix<double>::~TPZFMatrix(&jac.super_TPZFMatrix<double>,&PTR_PTR_0183dba8);
            centerPoint._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            if (centerPoint.fStore != (double *)0x0) {
              operator_delete__(centerPoint.fStore);
            }
            local_3ba0.fRef = (TPZReference *)0x0;
            local_3ba0.fRef = (TPZReference *)operator_new(0x10);
            ((local_3ba0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
            (local_3ba0.fRef)->fPointer = (TPZMatrix<double> *)this_00;
            LOCK();
            ((local_3ba0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
            UNLOCK();
            TPZStepSolver<double>::TPZStepSolver(&MSolve,&local_3ba0);
            TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3ba0);
            TPZStepSolver<double>::SetDirect(&MSolve,ELU);
            TPZStepSolver<double>::Solve
                      (&MSolve,&MSL.super_TPZFMatrix<double>,&MSL.super_TPZFMatrix<double>,
                       (TPZFMatrix<double> *)0x0);
            uVar9 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0x248))(this,side);
            uVar10 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl +
                                 0x248))(large);
            TPZBlock::TPZBlock(&MBlocksmall,(TPZBaseMatrix *)0x0,uVar9,1);
            TPZBlock::TPZBlock(&MBlocklarge,(TPZBaseMatrix *)0x0,uVar10,1);
            if (0 < (int)uVar9) {
              uVar17 = 0;
              do {
                uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                               super_TPZInterpolatedElement.
                                               super_TPZInterpolationSpace.super_TPZCompEl + 0x250))
                                  (this,uVar17,side);
                lVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                                super_TPZInterpolatedElement.
                                                super_TPZInterpolationSpace.super_TPZCompEl + 0xa8))
                                   (this,uVar8);
                TPZBlock::Set(&MBlocksmall,uVar17,*(int *)(lVar12 + 0x18),-1);
                uVar17 = uVar17 + 1;
              } while (uVar9 != uVar17);
            }
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                uVar8 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl
                                    + 0x250))(large,uVar17,neighbourside);
                lVar12 = (**(code **)(*(long *)&(large->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0xa8))(large,uVar8);
                TPZBlock::Set(&MBlocklarge,uVar17,*(int *)(lVar12 + 0x18),-1);
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            TPZBlock::Resequence(&MBlocksmall,0);
            TPZBlock::Resequence(&MBlocklarge,0);
            thisTrace.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZFNMatrix<20,_double>::TPZFNMatrix
                      (&blocknorm,(long)(int)uVar9,(long)(int)uVar10,(double *)&thisTrace);
            uVar21 = (ulong)uVar10;
            if (0 < (int)uVar9) {
              uVar20 = 0;
              local_3b90 = (ulong)uVar9;
              do {
                uVar17 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar20].dim;
                if ((ulong)uVar17 != 0 && 0 < (int)uVar10) {
                  uVar22 = 0;
                  do {
                    uVar3 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar22].dim;
                    if ((ulong)uVar3 != 0) {
                      if (0 < (int)uVar17) {
                        iVar5 = MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar20].pos;
                        iVar6 = MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar22].pos;
                        local_3bd0 = 0;
                        do {
                          if (0 < (int)uVar3) {
                            lVar12 = local_3bd0 + (long)iVar5;
                            uVar18 = (ulong)uVar3;
                            lVar23 = (long)iVar6;
                            do {
                              if ((((lVar12 < 0) ||
                                   (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                    super_TPZBaseMatrix.fRow <= lVar12)) || (lVar23 < 0)) ||
                                 (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                  super_TPZBaseMatrix.fCol <= lVar23)) {
                                TPZFMatrix<double>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              if (((MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                    super_TPZBaseMatrix.fRow <= lVar12 || lVar12 < 0) ||
                                  (lVar23 < 0)) ||
                                 (MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                  super_TPZBaseMatrix.fCol <= lVar23)) {
                                TPZFMatrix<double>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                   super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                                 (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                  super_TPZBaseMatrix.fCol <= (long)uVar22)) {
                                TPZFMatrix<double>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              blocknorm.super_TPZFMatrix<double>.fElem
                              [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * uVar22 + uVar20] =
                                   ABS(MSL.super_TPZFMatrix<double>.fElem
                                       [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                        super_TPZBaseMatrix.fRow * lVar23 + lVar12]) *
                                   ABS(MSL.super_TPZFMatrix<double>.fElem
                                       [MSL.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                        super_TPZBaseMatrix.fRow * lVar23 + lVar12]) +
                                   blocknorm.super_TPZFMatrix<double>.fElem
                                   [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                                    super_TPZBaseMatrix.fRow * uVar22 + uVar20];
                              lVar23 = lVar23 + 1;
                              uVar18 = uVar18 - 1;
                            } while (uVar18 != 0);
                          }
                          local_3bd0 = local_3bd0 + 1;
                        } while (local_3bd0 != uVar17);
                      }
                      if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                         (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar22)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar22 + uVar20] =
                           blocknorm.super_TPZFMatrix<double>.fElem
                           [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fRow * uVar22 + uVar20] /
                           (double)(int)(uVar17 * uVar3);
                      if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                         (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar22)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      dVar1 = blocknorm.super_TPZFMatrix<double>.fElem
                              [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                               super_TPZBaseMatrix.fRow * uVar22 + uVar20];
                      if (dVar1 < 0.0) {
                        dVar1 = sqrt(dVar1);
                      }
                      else {
                        dVar1 = SQRT(dVar1);
                      }
                      if ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                         (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= (long)uVar22)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar22 + uVar20] = dVar1;
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != uVar21);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != local_3b90);
            }
            uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0x310))(this,side);
            pTVar13 = (TPZConnect *)
                      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                             super_TPZInterpolatedElement.
                                             super_TPZInterpolationSpace.super_TPZCompEl + 0xa8))
                                (this,uVar8);
            uVar8 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0x310))(this,side);
            myindex = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                             super_TPZInterpolatedElement.
                                             super_TPZInterpolationSpace.super_TPZCompEl + 0xa0))
                                (this,uVar8);
            lVar12 = (long)(int)(uVar9 - 1);
            if ((int)uVar10 < 1) {
              bVar25 = true;
            }
            else {
              lVar23 = 0xc;
              uVar20 = 0;
              lVar24 = 0;
              do {
                if ((MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar12].dim != 0) &&
                   (*(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                    super_TPZSavable)._vptr_TPZSavable + lVar23) != 0)) {
                  iVar15 = TPZInterpolatedElement::SideConnectIndex(large,(int)uVar20,neighbourside)
                  ;
                  pTVar16 = TPZConnect::AddDependency
                                      (pTVar13,myindex,iVar15,&MSL.super_TPZFMatrix<double>,
                                       (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                                             [lVar12].pos,
                                       (long)*(int *)((long)MBlocklarge.fBlock.
                                                            super_TPZVec<TPZBlock::TNode>.fStore +
                                                     lVar23 + -4),
                                       MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                                       [lVar12].dim,
                                       *(int *)((long)&((MBlocklarge.fBlock.
                                                         super_TPZVec<TPZBlock::TNode>.fStore)->
                                                       super_TPZSavable)._vptr_TPZSavable + lVar23))
                  ;
                  if (((int)uVar9 < 1) ||
                     ((blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow <= lVar12 ||
                      (blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fCol <= (long)uVar20)))) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if (blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar20 + lVar12] <= 1e-08 &&
                      blocknorm.super_TPZFMatrix<double>.fElem
                      [blocknorm.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow * uVar20 + lVar12] != 1e-08) {
                    memset((pTVar16->fDepMatrix).super_TPZFMatrix<double>.fElem,0,
                           (pTVar16->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow *
                           (pTVar16->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fCol * 8);
                    (pTVar16->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fDecomposed = '\0';
                  }
                  lVar24 = lVar24 + 1;
                }
                uVar20 = uVar20 + 1;
                lVar23 = lVar23 + 0x10;
              } while (uVar21 != uVar20);
              bVar25 = lVar24 == 0;
            }
            if (!(bool)(bVar25 ^ 1U | (int)uVar10 < 1)) {
              lVar23 = 0xc;
              uVar20 = 0;
              do {
                iVar15 = TPZInterpolatedElement::SideConnectIndex(large,(int)uVar20,neighbourside);
                iVar5 = *(int *)((long)&((MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.fStore)->
                                        super_TPZSavable)._vptr_TPZSavable + lVar23);
                if (iVar5 != 0) {
                  TPZConnect::AddDependency
                            (pTVar13,myindex,iVar15,&MSL.super_TPZFMatrix<double>,
                             (long)MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar12].
                                   pos,
                             (long)*(int *)((long)MBlocklarge.fBlock.super_TPZVec<TPZBlock::TNode>.
                                                  fStore + lVar23 + -4),
                             MBlocksmall.fBlock.super_TPZVec<TPZBlock::TNode>.fStore[lVar12].dim,
                             iVar5);
                }
                uVar20 = uVar20 + 1;
                lVar23 = lVar23 + 0x10;
              } while (uVar21 != uVar20);
            }
            (**(code **)(*plVar11 + 8))(plVar11);
            TPZFMatrix<double>::~TPZFMatrix(&blocknorm.super_TPZFMatrix<double>,&PTR_PTR_0183e568);
            TPZBlock::~TPZBlock(&MBlocklarge);
            TPZBlock::~TPZBlock(&MBlocksmall);
            TPZStepSolver<double>::~TPZStepSolver(&MSolve);
            TPZManVector<double,_3>::~TPZManVector(&pointl);
            TPZManVector<double,_3>::~TPZManVector(&par);
            TPZFMatrix<double>::~TPZFMatrix(&MSL.super_TPZFMatrix<double>,&PTR_PTR_01884558);
          }
          TPZTransform<double>::~TPZTransform(&t);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Exiting RestrainSide - dimension of large element is 0",
                   0x36);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        lineN = 0x2b8;
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                 ,lineN);
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    const TPZCompElSide thisCompSide(this, side);
    const TPZCompElSide largeCompSide(large, neighbourside);
    TPZGeoElSide thisGeoSide(this->Reference(), side);
    const TPZGeoElSide largeGeoSide = largeCompSide.Reference();
    const auto thisSideDimension = thisGeoSide.Dimension();
    const auto largeSideDimension = largeGeoSide.Dimension();


    TPZInterpolatedElement *largeCel = nullptr;
    if (largeCompSide.Exists()) largeCel = dynamic_cast<TPZInterpolatedElement *> (largeCompSide.Element());
    if (!largeCel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    const auto connectLocId = this->MidSideConnectLocId(side);
    if (connectLocId < 0) {
        DebugStop();
    }
    const TPZConnect &myConnect = this->Connect(connectLocId);
    if (myConnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myConnect.HasDependency() && largeSideDimension > 0) {
        LOGPZ_ERROR(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (largeCel->ConnectIndex(largeCel->MidSideConnectLocId(largeCompSide.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largeSideDimension == 0) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - dimension of large element is 0");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisSideDimension);
    thisGeoSide.SideTransform3(largeGeoSide, t);
    const auto nSideConnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nSideConnects; sidecon++) {
        TPZConnect &c = this->SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    const auto largeOrder = large->EffectiveSideOrder(neighbourside);
    const auto sideOrder = this->MidSideConnect(side).Order();
    if (sideOrder < largeOrder && thisSideDimension && largeSideDimension) {
        DebugStop();
    }
    TPZIntPoints *intrule = this->Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    const auto numint = intrule->NPoints();
    const auto numshape = this->NSideShapeF(side);
    const auto numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(thisSideDimension), pointl(largeSideDimension);

    {
        REAL detjac;
        TPZVec<REAL> centerPoint(thisSideDimension,0);
        thisGeoSide.CenterPoint(centerPoint);
        TPZFNMatrix<9,REAL> jac(thisSideDimension,thisSideDimension),jacinv(thisSideDimension,thisSideDimension),axes(thisSideDimension,3);
        thisGeoSide.Jacobian(centerPoint, jac, axes, detjac, jacinv);
        REAL weight;
        TPZFNMatrix<100, REAL> phis(numshape, 3), dphis(3, numshape), phil(numshapel, 3), dphil(3, numshapel);
        TPZFNMatrix<100, REAL> thisTrace(numshape, 3), largeTrace(numshapel, 3);
        for (int it = 0; it < numint; it++) {
            intrule->Point(it, par, weight);
            SideShapeFunction(side, par, thisTrace, dphis);
            t.Apply(par, pointl);
            large->SideShapeFunction(neighbourside, pointl, largeTrace, dphil);
            for (auto in = 0; in < numshape; in++) {
                for (auto jn = 0; jn < numshape; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * thisTrace(jn,iaxes);
                    }
                    (*M)(in, jn) += dotProduct * weight;
                }
                for (auto jn = 0; jn < numshapel; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * largeTrace(jn,iaxes);
                    }
                    MSL(in, jn) += dotProduct * weight;
                }
            }
        }
    }

#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    const auto thisNumSideNodes = NSideConnects(side);
    const auto largeNumSideNodes = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, thisNumSideNodes), MBlocklarge(0, largeNumSideNodes);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = this->Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (auto in = 0; in < largeNumSideNodes; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(thisNumSideNodes, largeNumSideNodes, 0.);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    this->CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = this->Connect(this->MidSideConnectLocId(side));
    const auto inodindex = ConnectIndex(this->MidSideConnectLocId(side));
    int64_t ndepend = 0;
    const auto in = thisNumSideNodes - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (auto jn = 0; jn < largeNumSideNodes; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                                           MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                   MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // restraint matrix should be equal to MSL
    {
        TPZCheckRestraint test(thisCompSide, largeCompSide);
        int64_t imsl, jmsl;
        const int64_t rmsl = MSL.Rows();
        const int64_t cmsl = MSL.Cols();
        const int64_t rtest = test.RestraintMatrix().Rows();
        const int64_t ctest = test.RestraintMatrix().Cols();

        if (rtest != rmsl || ctest != cmsl) {
            std::stringstream sout;
            sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                 << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n";
            LOGPZ_ERROR(logger, sout.str())
            return;
        }

        TPZFMatrix<REAL> mslc(MSL);
        mslc -= test.RestraintMatrix();

        REAL normmsl = 0.;
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
            }
        }
        if (normmsl > 1.E-6) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
            mslc.Print("Difference Matrix ", sout);
            for (imsl = 0; imsl < rmsl; imsl++) {
                for (jmsl = 0; jmsl < cmsl; jmsl++) {
                    if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                        sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                             << test.RestraintMatrix()(imsl, jmsl) << std::endl;
                    }
                }
            }
            LOGPZ_ERROR(logger, sout.str())
        }

        if (test.CheckRestraint()) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::Bad restraints detected\n";
            test.Print(sout);
            test.Diagnose();
            LOGPZ_ERROR(logger, sout.str())
        }
    }
#endif
}